

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void __thiscall
phmap::priv::
CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
::CompressedTuple(CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
                  *this,CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
                        *param_2)

{
  CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  *in_RSI;
  CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  *in_stack_ffffffffffffffe8;
  
  internal_compressed_tuple::
  CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  ::CompressedTupleImpl(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

class PHMAP_INTERNAL_COMPRESSED_TUPLE_DECLSPEC CompressedTuple
			: private internal_compressed_tuple::CompressedTupleImpl<
			  CompressedTuple<Ts...>, phmap::index_sequence_for<Ts...>> {
		private:
			template <int I>
			using ElemT = internal_compressed_tuple::ElemT<CompressedTuple, I>;

		public:
			constexpr CompressedTuple() = default;
			explicit constexpr CompressedTuple(Ts... base)
				: CompressedTuple::CompressedTupleImpl(phmap::forward<Ts>(base)...) {}

			template <int I>
			ElemT<I>& get() & {
				return internal_compressed_tuple::Storage<CompressedTuple, I>::get();
			}

			template <int I>
			constexpr const ElemT<I>& get() const&
			{
				return internal_compressed_tuple::Storage<CompressedTuple, I>::get();
			}

			template <int I>
			ElemT<I>&& get() && {
				return std::move(*this)
				.internal_compressed_tuple::template Storage<CompressedTuple, I>::get();
			}

			template <int I>
			constexpr const ElemT<I>&& get() const&&
			{
				return phmap::move(*this)
				       .internal_compressed_tuple::template Storage<CompressedTuple, I>::get();
			}
		}